

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O3

void player_flags(player *p,bitflag *f)

{
  player_race *ppVar1;
  _Bool _Var2;
  
  ppVar1 = p->race;
  *(undefined2 *)(f + 4) = *(undefined2 *)(ppVar1->flags + 4);
  *(undefined4 *)f = *(undefined4 *)ppVar1->flags;
  flag_union(f,p->class->flags,6);
  _Var2 = flag_has_dbg((p->state).pflags,10,0x19,"p->state.pflags","(PF_BRAVERY_30)");
  if ((_Var2) && (0x1d < p->lev)) {
    flag_on_dbg(f,6,6,"f","OF_PROT_FEAR");
    return;
  }
  return;
}

Assistant:

void player_flags(struct player *p, bitflag f[OF_SIZE])
{
	/* Add racial flags */
	memcpy(f, p->race->flags, sizeof(p->race->flags));
	of_union(f, p->class->flags);

	/* Some classes become immune to fear at a certain plevel */
	if (player_has(p, PF_BRAVERY_30) && p->lev >= 30) {
		of_on(f, OF_PROT_FEAR);
	}
}